

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.h
# Opt level: O3

int b_array::first_ge<Map::Pair<long,int>>
              (Array<Map::Pair<long,_int>_> *data,size_t size,Pair<long,_int> *entry)

{
  Pair<long,_int> *pPVar1;
  size_t index;
  size_t sVar2;
  
  sVar2 = size;
  if (size != 0) {
    pPVar1 = Array<Map::Pair<long,_int>_>::operator[](data,0);
    sVar2 = 0;
    if (pPVar1->key < entry->key) {
      sVar2 = 1;
      do {
        index = sVar2;
        sVar2 = size;
        if (size == index) goto LAB_00117aec;
        pPVar1 = Array<Map::Pair<long,_int>_>::operator[](data,index);
        sVar2 = index + 1;
      } while (pPVar1->key < entry->key);
      sVar2 = index;
      if (size <= index) {
        sVar2 = size;
      }
    }
  }
LAB_00117aec:
  return (int)sVar2;
}

Assistant:

int first_ge(const b_array::Array<T>& data, size_t size, const T& entry) {
    for (size_t i = 0; i < size; i++) {
        if (data[i] >= entry) {
            return i;
        }
    }
    return size;
}